

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this)

{
  CopyingOutputStreamAdaptor *in_RDI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *unaff_retaddr;
  
  (in_RDI->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CopyingOutputStreamAdaptor_00898e18;
  WriteBuffer(in_RDI);
  if (((in_RDI->owns_copying_stream_ & 1U) != 0) &&
     (in_RDI->copying_stream_ != (CopyingOutputStream *)0x0)) {
    (*in_RDI->copying_stream_->_vptr_CopyingOutputStream[1])();
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (unaff_retaddr);
  ZeroCopyOutputStream::~ZeroCopyOutputStream(&in_RDI->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor() {
  WriteBuffer();
  if (owns_copying_stream_) {
    delete copying_stream_;
  }
}